

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3MulInt64(i64 *pA,i64 iB)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  
  uVar1 = *pA;
  if (iB < 1) {
    if (iB < 0) {
      if ((long)uVar1 < 1) {
        if (((long)uVar1 < 0) &&
           (auVar5._8_8_ = 0, auVar5._0_8_ = -iB,
           SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar5,0) < -uVar1)) {
          return 1;
        }
      }
      else {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar1;
        lVar6 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) / auVar4,0);
        if ((ulong)iB <= (ulong)-lVar6 && -iB != lVar6) {
          return 1;
        }
      }
    }
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = iB;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar2,0) < (long)uVar1) {
      return 1;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = iB;
    lVar6 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) / auVar3,0);
    if (SBORROW8(uVar1,-lVar6) != (long)(uVar1 + lVar6) < 0) {
      return 1;
    }
  }
  *pA = uVar1 * iB;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3MulInt64(i64 *pA, i64 iB){
#if GCC_VERSION>=5004000 && !defined(__INTEL_COMPILER)
  return __builtin_mul_overflow(*pA, iB, pA);
#else
  i64 iA = *pA;
  if( iB>0 ){
    if( iA>LARGEST_INT64/iB ) return 1;
    if( iA<SMALLEST_INT64/iB ) return 1;
  }else if( iB<0 ){
    if( iA>0 ){
      if( iB<SMALLEST_INT64/iA ) return 1;
    }else if( iA<0 ){
      if( iB==SMALLEST_INT64 ) return 1;
      if( iA==SMALLEST_INT64 ) return 1;
      if( -iA>LARGEST_INT64/-iB ) return 1;
    }
  }
  *pA = iA*iB;
  return 0;
#endif
}